

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O3

ssize_t __thiscall Buffers::read(Buffers *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__dest;
  iterator __position;
  Buffers *pBVar1;
  long lVar2;
  undefined4 in_register_00000034;
  void *__src;
  void *__n;
  
  if ((__buf == (void *)0x0) ||
     (pBVar1 = (Buffers *)
               (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
               super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.
               super__List_node_base._M_next, pBVar1 == this)) {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    do {
      __n = (void *)(pBVar1->mBufferOffset - this->mBufferOffset);
      __dest = (void *)(CONCAT44(in_register_00000034,__fd) + lVar2);
      __src = (void *)(this->mBufferOffset +
                      (pBVar1->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
                      super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node._M_size);
      if (__buf < __n || (void *)((long)__buf - (long)__n) == (void *)0x0) {
        memcpy(__dest,__src,(size_t)__buf);
        if (__buf == __n) {
          this->mBufferOffset = 0;
          std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::_M_erase
                    ((list<Buffer,_std::allocator<Buffer>_> *)this,
                     (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
                     super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.
                     super__List_node_base._M_next);
        }
        else {
          this->mBufferOffset = this->mBufferOffset + (long)__buf;
        }
        return lVar2 + (long)__buf;
      }
      memcpy(__dest,__src,(size_t)__n);
      this->mBufferOffset = 0;
      __position._M_node =
           (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
           super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.super__List_node_base.
           _M_next;
      if ((Buffers *)__position._M_node == this) {
        __assert_fail("!mBuffers.isEmpty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Buffer.h"
                      ,0x8f,"size_t Buffers::read(void *, size_t)");
      }
      std::__cxx11::list<Buffer,_std::allocator<Buffer>_>::_M_erase
                ((list<Buffer,_std::allocator<Buffer>_> *)this,__position);
      lVar2 = lVar2 + (long)__n;
      pBVar1 = (Buffers *)
               (this->mBuffers).super_list<Buffer,_std::allocator<Buffer>_>.
               super__List_base<Buffer,_std::allocator<Buffer>_>._M_impl._M_node.
               super__List_node_base._M_next;
      __buf = (void *)((long)__buf - (long)__n);
    } while (pBVar1 != this);
  }
  return lVar2;
}

Assistant:

size_t read(void *outPtr, size_t size)
    {
        if (!size)
            return 0;

        unsigned char *out = static_cast<unsigned char *>(outPtr);
        size_t read = 0, remaining = size;
        while (!mBuffers.empty()) {
            const auto &buf = mBuffers.front();
            const size_t bufferSize = buf.size() - mBufferOffset;

            if (remaining <= bufferSize) {
                memcpy(out + read, buf.data() + mBufferOffset, remaining);
                if (remaining == bufferSize) {
                    mBufferOffset = 0;
                    mBuffers.pop_front();
                } else {
                    mBufferOffset = remaining + mBufferOffset;
                }
                read += remaining;
                break;
            }
            memcpy(out + read, buf.data() + mBufferOffset, bufferSize);
            read += bufferSize;
            mBufferOffset = 0;
            remaining -= bufferSize;
            assert(!mBuffers.isEmpty());
            mBuffers.pop_front();
        }
        return read;
    }